

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Export.cpp
# Opt level: O2

Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
exportC_abi_cxx11_(Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,Resources *res,ExportSettings *settings,Pipeline *p,
                  IAutomation *automation)

{
  pointer *ppSVar1;
  _Alloc_hider _Var2;
  Type TVar3;
  _Rb_tree_color _Var4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Flag FVar8;
  char *__filename;
  pointer pbVar9;
  pointer p_Var10;
  pointer pCVar11;
  pointer pCVar12;
  pointer __ptr;
  size_t __n;
  _func_int **pp_Var13;
  pointer pPVar14;
  pointer pCVar15;
  _Head_base<0UL,__IO_FILE_*,_false> _Var16;
  undefined8 uVar17;
  element_type *peVar18;
  pointer pSVar19;
  ExportResult *pEVar20;
  string *__lhs;
  const_iterator cVar21;
  const_iterator cVar22;
  size_t sVar23;
  size_type sVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar25;
  pointer pTVar26;
  char *pcVar27;
  pointer pFVar28;
  undefined *puVar29;
  ulong uVar30;
  pointer pFVar31;
  Resources *pRVar32;
  pointer pTVar33;
  char *pcVar34;
  long lVar35;
  ulong uVar36;
  Command *cmd;
  pointer pCVar37;
  size_t i;
  Section *it;
  pointer pbVar38;
  pointer str;
  key_type *__k;
  pointer pSVar39;
  undefined4 uVar40;
  double dVar41;
  double dVar42;
  size_t sStackY_260;
  unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> f;
  string local_238;
  string srn;
  shared_ptr<PolledShaderSource> shader;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  bool local_1d0;
  pointer local_1c8;
  pointer local_1c0;
  ExportSettings *local_1b8;
  Resources *local_1b0;
  Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  shader_source;
  shared_ptr<PolledShaderSource> shader_1;
  ExportResult automation_result;
  string vname;
  unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> out;
  string filename;
  Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  automation_export;
  UniformsMap global_uniforms;
  
  __filename = (settings->c_source)._M_dataplus._M_p;
  local_1c0 = (pointer)automation;
  local_1b8 = settings;
  local_1b0 = res;
  aAppDebugPrintf("Exporting rendering pipeline to \'%s\'",__filename);
  f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (_IO_FILE *)fopen(__filename,"w");
  f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
  super__Tuple_impl<1UL,_int_(*)(_IO_FILE_*)>.super__Head_base<1UL,_int_(*)(_IO_FILE_*),_false>.
  _M_head_impl = (_Head_base<1UL,_int_(*)(_IO_FILE_*),_false>)fclose;
  if ((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
              super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
              super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl == (FILE *)0x0) {
    format_abi_cxx11_((string *)&automation_result,"Cannot open file \'%s\' for writing",__filename)
    ;
    automation_export.field_0.value_.sections.super__Vector_base<Section,_std::allocator<Section>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)((long)&automation_export.field_0 + 0x10);
    ppSVar1 = &automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)ppSVar1) {
      automation_export.field_0._24_8_ = automation_result.uniforms._M_t._M_impl._0_8_;
    }
    else {
      automation_export.field_0.value_.sections.
      super__Vector_base<Section,_std::allocator<Section>_>._M_impl.super__Vector_impl_data._M_start
           = automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>.
             _M_impl.super__Vector_impl_data._M_start;
    }
    automation_export.field_0.value_.sections.super__Vector_base<Section,_std::allocator<Section>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
         super__Vector_impl_data._M_finish;
    automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)automation_result.sections.
                          super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppSVar1;
    Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,(UnexpectedType *)&automation_export);
    std::__cxx11::string::~string((string *)&automation_export);
    std::__cxx11::string::~string((string *)&automation_result);
  }
  else {
    global_uniforms._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &global_uniforms._M_t._M_impl.super__Rb_tree_header._M_header;
    global_uniforms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    global_uniforms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    global_uniforms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pbVar9 = (p->shader_filenames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1c8 = (pointer)__return_storage_ptr__;
    global_uniforms._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         global_uniforms._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (pbVar38 = (p->shader_filenames).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar38 != pbVar9;
        pbVar38 = pbVar38 + 1) {
      Resources::getShaderSource((Resources *)&shader,(string *)local_1b0);
      if (shader.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        format_abi_cxx11_((string *)&automation_result,"Cannot open shader \'%s\'",
                          (pbVar38->_M_dataplus)._M_p);
        __return_storage_ptr__ =
             (Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1c8;
        automation_export.field_0.value_.sections.
        super__Vector_base<Section,_std::allocator<Section>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)((long)&automation_export.field_0 + 0x10);
        ppSVar1 = &automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl
            .super__Vector_impl_data._M_start == (pointer)ppSVar1) {
          automation_export.field_0._24_8_ = automation_result.uniforms._M_t._M_impl._0_8_;
        }
        else {
          automation_export.field_0.value_.sections.
          super__Vector_base<Section,_std::allocator<Section>_>._M_impl.super__Vector_impl_data.
          _M_start = automation_result.sections.
                     super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
                     super__Vector_impl_data._M_start;
        }
        automation_export.field_0.value_.sections.
        super__Vector_base<Section,_std::allocator<Section>_>._M_impl.super__Vector_impl_data.
        _M_finish = automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)automation_result.sections.
                              super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
        automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppSVar1;
        Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1c8,(UnexpectedType *)&automation_export);
        std::__cxx11::string::~string((string *)&automation_export);
        std::__cxx11::string::~string((string *)&automation_result);
LAB_0010ea70:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&shader.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        goto LAB_0010f334;
      }
      aAppDebugPrintf("%s: uniforms: %d",(pbVar38->_M_dataplus)._M_p,
                      (ulong)(uint)((shader.
                                     super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->flat_source_).uniforms_._M_t._M_impl.
                                   super__Rb_tree_header._M_node_count);
      ::shader::appendUniforms
                ((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&automation_export,&global_uniforms,
                 &((shader.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->flat_source_).uniforms_);
      if (automation_export.field_0.value_.uniforms._M_t._M_impl.super__Rb_tree_header._M_header.
          _M_color._0_1_ == '\0') {
        pbVar25 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::error((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&automation_export);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &shader_source,"Error merging uniforms from vertex: ",pbVar25);
        __return_storage_ptr__ =
             (Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1c8;
        automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&automation_result.sections.
                       super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        _Var2._M_p = (pointer)((long)&shader_source.field_0 + 0x10);
        if (shader_source.field_0.value_._M_dataplus._M_p == (_Alloc_hider)_Var2._M_p) {
          automation_result.uniforms._M_t._M_impl._0_8_ = shader_source.field_0._24_8_;
        }
        else {
          automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)shader_source.field_0.value_._M_dataplus._M_p;
        }
        automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT71(shader_source.field_0._17_7_,shader_source.field_0._16_1_);
        automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)shader_source.field_0.value_._M_string_length;
        shader_source.field_0.value_._M_string_length = 0;
        shader_source.field_0._16_1_ = 0;
        shader_source.field_0._0_8_ = _Var2._M_p;
        Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1c8,(UnexpectedType *)&automation_result);
        std::__cxx11::string::~string((string *)&automation_result);
        std::__cxx11::string::~string((string *)&shader_source);
        Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&automation_export);
        goto LAB_0010ea70;
      }
      Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&automation_export);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&shader.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    (**(_func_int **)((long)(local_1c0->super_path)._M_pathname._M_dataplus._M_p + 0x30))
              (&automation_export,local_1c0,1,"C",&global_uniforms);
    if (automation_export.has_value_ == false) {
      pbVar25 = Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::error(&automation_export);
      format_abi_cxx11_((string *)&shader_source,"Error exporting automation data: %s",
                        (pbVar25->_M_dataplus)._M_p);
      automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&automation_result.sections.
                     super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
      _Var2._M_p = (pointer)((long)&shader_source.field_0 + 0x10);
      if (shader_source.field_0.value_._M_dataplus._M_p == (_Alloc_hider)_Var2._M_p) {
        automation_result.uniforms._M_t._M_impl._0_8_ = shader_source.field_0._24_8_;
      }
      else {
        automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)shader_source.field_0.value_._M_dataplus._M_p;
      }
      automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT71(shader_source.field_0._17_7_,shader_source.field_0._16_1_);
      automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)shader_source.field_0.value_._M_string_length;
      shader_source.field_0.value_._M_string_length = 0;
      shader_source.field_0._16_1_ = 0;
      shader_source.field_0._0_8_ = _Var2._M_p;
      Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1c8,(UnexpectedType *)&automation_result);
      std::__cxx11::string::~string((string *)&automation_result);
      std::__cxx11::string::~string((string *)&shader_source);
    }
    else {
      pEVar20 = Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::value(&automation_export);
      IAutomation::ExportResult::ExportResult(&automation_result,pEVar20);
      str = (pointer)(p->shader_filenames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      p_Var10 = (pointer)(p->shader_filenames).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
      __lhs = &local_1b8->shader_path;
      while( true ) {
        pSVar19 = automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pSVar39 = automation_result.sections.super__Vector_base<Section,_std::allocator<Section>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (str == p_Var10) break;
        validateName(&vname,(string *)str);
        local_1c0 = str;
        Resources::getShaderSource((Resources *)&shader_1,(string *)local_1b0);
        peVar18 = shader_1.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        shader.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1e0._M_allocated_capacity = local_1e0._M_allocated_capacity & 0xffffffffffffff00;
        shader.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_1e0;
        if (((shader_1.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            flat_source_).version_ != 0) {
          format_abi_cxx11_(&srn,"#version %d\n");
          std::__cxx11::string::operator=((string *)&shader,(string *)&srn);
          std::__cxx11::string::~string((string *)&srn);
        }
        if (0 < automation_result.buffer_size) {
          format_abi_cxx11_(&srn,"uniform float u[%d];\n");
          std::__cxx11::string::append((string *)&shader);
          std::__cxx11::string::~string((string *)&srn);
        }
        pCVar11 = (peVar18->flat_source_).chunks_.
                  super__Vector_base<shader::Source::Chunk,_std::allocator<shader::Source::Chunk>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pCVar12 = (peVar18->flat_source_).chunks_.
                  super__Vector_base<shader::Source::Chunk,_std::allocator<shader::Source::Chunk>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        while (__k = &pCVar11->value, pCVar11 = (pointer)((long)&__k[-1].field_2 + 8),
              pCVar11 != pCVar12) {
          TVar3 = pCVar11->type;
          if (TVar3 == String) {
            std::__cxx11::string::append((string *)&shader);
          }
          else {
            if (TVar3 == Uniform) {
              cVar21 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
                       ::find(&(peVar18->flat_source_).uniforms_._M_t,__k);
              if ((_Rb_tree_header *)cVar21._M_node ==
                  &(peVar18->flat_source_).uniforms_._M_t._M_impl.super__Rb_tree_header) {
                format_abi_cxx11_(&local_238,"Cannot find uniform chunk \'%s\' in uniforms",
                                  (__k->_M_dataplus)._M_p);
              }
              else {
                cVar22 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>_>
                         ::find(&automation_result.uniforms._M_t,__k);
                if ((_Rb_tree_header *)cVar22._M_node !=
                    &automation_result.uniforms._M_t._M_impl.super__Rb_tree_header) {
                  _Var4 = cVar22._M_node[2]._M_color;
                  uVar30 = (ulong)_Var4;
                  if ((int)_Var4 < 0) {
                    if (cVar21._M_node[2]._M_color - _S_black < 4) {
                      uVar40 = SUB84((double)*(float *)&cVar22._M_node[2].field_0x4,0);
                      dVar41 = (double)*(float *)&cVar22._M_node[2]._M_parent;
                      dVar42 = (double)*(float *)((long)&cVar22._M_node[2]._M_parent + 4);
                      switch(cVar21._M_node[2]._M_color) {
                      case _S_black:
                        format_abi_cxx11_(&srn,"%f",uVar40,dVar41,dVar42);
                        std::__cxx11::string::append((string *)&shader);
                        break;
                      case 2:
                        format_abi_cxx11_(&srn,"vec2(%f,%f)",uVar40,dVar41,dVar42);
                        std::__cxx11::string::append((string *)&shader);
                        break;
                      case 3:
                        format_abi_cxx11_(&srn,"vec3(%f,%f,%f)",uVar40,dVar41,dVar42);
                        std::__cxx11::string::append((string *)&shader);
                        break;
                      case 4:
                        format_abi_cxx11_(&srn,"vec4(%f,%f,%f,%f)",uVar40,dVar41,dVar42,
                                          (double)*(float *)&cVar22._M_node[2]._M_left);
                        std::__cxx11::string::append((string *)&shader);
                      }
                      goto LAB_0010e4bf;
                    }
                  }
                  else {
                    switch(cVar21._M_node[2]._M_color) {
                    case _S_black:
                      format_abi_cxx11_(&srn,"u[%d]");
                      std::__cxx11::string::append((string *)&shader);
                      break;
                    case 2:
                      format_abi_cxx11_(&srn,"vec2(u[%d],u[%d])",uVar30,(ulong)(_Var4 + _S_black));
                      std::__cxx11::string::append((string *)&shader);
                      break;
                    case 3:
                      format_abi_cxx11_(&srn,"vec3(u[%d],u[%d],u[%d])",uVar30,
                                        (ulong)(_Var4 + _S_black),(ulong)(_Var4 + 2));
                      std::__cxx11::string::append((string *)&shader);
                      break;
                    case 4:
                      format_abi_cxx11_(&srn,"vec4(u[%d],u[%d],u[%d],u[%d])",uVar30,
                                        (ulong)(_Var4 + _S_black),(ulong)(_Var4 + 2),
                                        (ulong)(_Var4 + 3));
                      std::__cxx11::string::append((string *)&shader);
                      break;
                    default:
                      goto switchD_0010e35a_default;
                    }
LAB_0010e4bf:
                    std::__cxx11::string::~string((string *)&srn);
                  }
                  goto switchD_0010e35a_default;
                }
                format_abi_cxx11_(&local_238,"Cannot find uniform \'%s\' in exported uniforms",
                                  (__k->_M_dataplus)._M_p);
              }
LAB_0010e533:
              srn._M_dataplus._M_p = (pointer)&srn.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p == &local_238.field_2) {
                srn.field_2._8_8_ = local_238.field_2._8_8_;
              }
              else {
                srn._M_dataplus._M_p = local_238._M_dataplus._M_p;
              }
              srn.field_2._M_allocated_capacity._1_7_ =
                   local_238.field_2._M_allocated_capacity._1_7_;
              srn.field_2._M_local_buf[0] = local_238.field_2._M_local_buf[0];
              srn._M_string_length = local_238._M_string_length;
              local_238._M_string_length = 0;
              local_238.field_2._M_local_buf[0] = '\0';
              local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
              Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Expected(&shader_source,(UnexpectedType *)&srn);
              std::__cxx11::string::~string((string *)&srn);
              std::__cxx11::string::~string((string *)&local_238);
              goto LAB_0010e5a4;
            }
            if (TVar3 == Include) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_238,"Include chunk is invalid in flat shader source",
                         (allocator<char> *)&filename);
              goto LAB_0010e533;
            }
          }
switchD_0010e35a_default:
          pCVar11 = (pointer)(__k + 1);
        }
        Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(&shader_source,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shader);
LAB_0010e5a4:
        std::__cxx11::string::~string((string *)&shader);
        _Var16 = f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                 super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                 super__Head_base<0UL,__IO_FILE_*,_false>;
        if (shader_source.has_value_ == false) {
          pp_Var13 = (_func_int **)(local_1c0->super_path)._M_pathname._M_dataplus._M_p;
          pbVar25 = Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::error(&shader_source);
          format_abi_cxx11_(&srn,"Cannot preporcess shader \'%s\': %s",pp_Var13,
                            (pbVar25->_M_dataplus)._M_p);
          shader.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_1e0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)srn._M_dataplus._M_p == &srn.field_2) {
            local_1e0._8_8_ = srn.field_2._8_8_;
          }
          else {
            shader.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)srn._M_dataplus._M_p;
          }
          local_1e0._M_allocated_capacity = srn.field_2._M_allocated_capacity;
          shader.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)srn._M_string_length;
          srn._M_string_length = 0;
          srn.field_2._M_allocated_capacity = srn.field_2._M_allocated_capacity & 0xffffffffffffff00
          ;
          srn._M_dataplus._M_p = (pointer)&srn.field_2;
          Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1c8,(UnexpectedType *)&shader);
          std::__cxx11::string::~string((string *)&shader);
          std::__cxx11::string::~string((string *)&srn);
LAB_0010f2eb:
          std::__cxx11::string::~string((string *)&shader_source);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&shader_1.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string((string *)&vname);
          goto LAB_0010f312;
        }
        pbVar25 = Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value(&shader_source);
        if ((local_1b8->shader_path)._M_string_length == 0) {
          fprintf((FILE *)_Var16._M_head_impl,"static const char %s[] =\n",vname._M_dataplus._M_p);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&srn,"\n",(allocator<char> *)&local_238);
          uVar30 = 0;
          while (uVar30 < pbVar25->_M_string_length) {
            sVar24 = std::__cxx11::string::find((string *)pbVar25,(ulong)&srn);
            if (sVar24 == 0xffffffffffffffff) {
              sVar24 = pbVar25->_M_string_length;
            }
            fprintf((FILE *)_Var16._M_head_impl,"\t\"%.*s\\n\"\n",
                    (ulong)(uint)((int)sVar24 - (int)uVar30),(pbVar25->_M_dataplus)._M_p + uVar30);
            uVar30 = sVar24 + srn._M_string_length;
          }
          fwrite(";\n\n",3,1,(FILE *)_Var16._M_head_impl);
          std::__cxx11::string::~string((string *)&srn);
          local_1d0 = true;
        }
        else {
          std::operator+(&filename,__lhs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1c0);
          aAppDebugPrintf("shader %s -> %s",vname._M_dataplus._M_p,filename._M_dataplus._M_p);
          __ptr = (pbVar25->_M_dataplus)._M_p;
          __n = pbVar25->_M_string_length;
          out._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
          super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl =
               (_IO_FILE *)fopen(filename._M_dataplus._M_p,"wb");
          out._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
          super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
          super__Tuple_impl<1UL,_int_(*)(_IO_FILE_*)>.
          super__Head_base<1UL,_int_(*)(_IO_FILE_*),_false>._M_head_impl =
               (_Head_base<1UL,_int_(*)(_IO_FILE_*),_false>)fclose;
          if ((FILE *)out._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                      super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                      super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl == (FILE *)0x0) {
            format_abi_cxx11_(&local_238,"Cannot open file \'%s\' for writing",
                              filename._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p == &local_238.field_2) goto LAB_0010e7b9;
LAB_0010e771:
            srn.field_2._M_allocated_capacity =
                 CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                          local_238.field_2._M_local_buf[0]);
            srn._M_dataplus._M_p = local_238._M_dataplus._M_p;
LAB_0010e7bf:
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            srn._M_string_length = local_238._M_string_length;
            local_238._M_string_length = 0;
            local_238.field_2._M_local_buf[0] = '\0';
            Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&shader,(UnexpectedType *)&srn);
            std::__cxx11::string::~string((string *)&srn);
            std::__cxx11::string::~string((string *)&local_238);
          }
          else {
            sVar23 = fwrite(__ptr,1,__n,
                            (FILE *)out._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>.
                                    _M_t.super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                                    super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
            if (sVar23 != __n) {
              format_abi_cxx11_(&local_238,"Cannot write %zu bytes, could write only %zu",__n,sVar23
                               );
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) goto LAB_0010e771;
LAB_0010e7b9:
              srn._M_dataplus._M_p = (pointer)&srn.field_2;
              srn.field_2._M_allocated_capacity =
                   CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                            local_238.field_2._M_local_buf[0]);
              srn.field_2._8_8_ = local_238.field_2._8_8_;
              goto LAB_0010e7bf;
            }
            local_1d0 = true;
          }
          std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::~unique_ptr(&out);
          std::__cxx11::string::~string((string *)&filename);
          if ((local_1d0 & 1U) == 0) {
            pbVar25 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::error((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&shader);
            format_abi_cxx11_(&local_238,"Cannot write shader \'%s\': %s",vname._M_dataplus._M_p,
                              (pbVar25->_M_dataplus)._M_p);
            srn._M_dataplus._M_p = (pointer)&srn.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p == &local_238.field_2) {
              srn.field_2._8_8_ = local_238.field_2._8_8_;
            }
            else {
              srn._M_dataplus._M_p = local_238._M_dataplus._M_p;
            }
            srn.field_2._M_allocated_capacity._1_7_ = local_238.field_2._M_allocated_capacity._1_7_;
            srn.field_2._M_local_buf[0] = local_238.field_2._M_local_buf[0];
            srn._M_string_length = local_238._M_string_length;
            local_238._M_string_length = 0;
            local_238.field_2._M_local_buf[0] = '\0';
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1c8,(UnexpectedType *)&srn);
            std::__cxx11::string::~string((string *)&srn);
            std::__cxx11::string::~string((string *)&local_238);
            Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&shader);
            goto LAB_0010f2eb;
          }
        }
        Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&shader);
        std::__cxx11::string::~string((string *)&shader_source);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&shader_1.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&vname);
        str = (pointer)&(local_1c0->super_path)._M_cmpts;
      }
      for (; pSVar39 != pSVar19; pSVar39 = pSVar39 + 1) {
        if (pSVar39->type == Data) {
          fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                          super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                  "#pragma data_seg(\".%s\")\n",(pSVar39->name)._M_dataplus._M_p);
          fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                          super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,"%.*s\n",
                  (ulong)(uint)(*(int *)&(pSVar39->data).
                                         super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                               (int)(pSVar39->data).super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start));
        }
      }
      pTVar33 = (p->textures).
                super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar26 = (p->textures).
                super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar33 != pTVar26) {
        fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                        super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                        super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                "static GLuint textures[%d];\n",((long)pTVar26 - (long)pTVar33) / 0x30 & 0xffffffff)
        ;
      }
      if ((p->framebuffers).
          super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (p->framebuffers).
          super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                        super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                        super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                "static GLuint framebuffers[%d];\n",
                ((long)(p->textures).
                       super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(p->textures).
                      super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x30 & 0xffffffff);
      }
      fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                      super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                      super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
              "static GLuint programs[%d];\n",
              (ulong)((long)(p->programs).
                            super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(p->programs).
                           super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
      fwrite("\nstatic void videoInit() {\n",0x1b,1,
             (FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                     super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                     super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      pTVar33 = (p->textures).
                super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar26 = (p->textures).
                super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar33 != pTVar26) {
        fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                        super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                        super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                "\tglGenTextures(%d, textures);\n",
                ((long)pTVar26 - (long)pTVar33) / 0x30 & 0xffffffff);
      }
      pFVar31 = (p->framebuffers).
                super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar28 = (p->framebuffers).
                super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pFVar31 != pFVar28) {
        fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                        super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                        super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                "\tglGenFramebuffers(%d, framebuffers);\n",
                ((long)pFVar28 - (long)pFVar31) / 0x14 & 0xffffffff);
      }
      pTVar33 = (p->textures).
                super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar26 = (p->textures).
                super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar33 != pTVar26) {
        lVar35 = 8;
        for (uVar30 = 0; uVar30 < (ulong)(((long)pTVar26 - (long)pTVar33) / 0x30);
            uVar30 = uVar30 + 1) {
          uVar36 = (ulong)*(uint *)((long)&pTVar33->w + lVar35);
          pcVar27 = "";
          pcVar34 = "";
          if (uVar36 < 3) {
            pcVar27 = &DAT_0019d6fc + *(int *)(&DAT_0019d6fc + uVar36 * 4);
            pcVar34 = &DAT_0019d708 + *(int *)(&DAT_0019d708 + uVar36 * 4);
          }
          fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                          super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                  "\ttextureInit(textures[%d], %d, %d, %s, %s);\n",uVar30 & 0xffffffff,
                  (ulong)*(uint *)((long)pTVar33 + lVar35 + -8),
                  (ulong)*(uint *)((long)pTVar33 + lVar35 + -4),pcVar34,pcVar27);
          pTVar33 = (p->textures).
                    super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pTVar26 = (p->textures).
                    super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          lVar35 = lVar35 + 0x30;
        }
        fputc(10,(FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                         super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      }
      pFVar31 = (p->framebuffers).
                super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar28 = (p->framebuffers).
                super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pFVar31 != pFVar28) {
        lVar35 = 4;
        for (uVar30 = 0; uVar30 < (ulong)(((long)pFVar28 - (long)pFVar31) / 0x14);
            uVar30 = uVar30 + 1) {
          fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                          super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                  "\tglBindFramebuffer(GL_FRAMEBUFFER, framebuffers[%d]);\n",uVar30 & 0xffffffff);
          for (uVar36 = 0; (long)uVar36 < (long)pFVar31[uVar30].textures_count; uVar36 = uVar36 + 1)
          {
            fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                            super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                            super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                    "\tglFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + %d, GL_TEXTURE_2D, textures[%d], 0);\n"
                    ,uVar36 & 0xffffffff,
                    (ulong)*(uint *)((long)pFVar31->textures + uVar36 * 4 + lVar35 + -4));
          }
          pFVar31 = (p->framebuffers).
                    super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pFVar28 = (p->framebuffers).
                    super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          lVar35 = lVar35 + 0x14;
        }
        fputc(10,(FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                         super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      }
      for (uVar30 = 0;
          _Var16._M_head_impl =
               f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
               super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
               super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
          pPVar14 = (p->programs).
                    super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          uVar30 < (ulong)((long)(p->programs).
                                 super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar14 >> 3);
          uVar30 = uVar30 + 1) {
        validateName((string *)&shader_source,
                     (p->shader_filenames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + pPVar14[uVar30].vertex);
        uVar17 = shader_source.field_0.value_._M_dataplus._M_p;
        validateName((string *)&shader,
                     (p->shader_filenames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     (p->programs).
                     super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar30].fragment);
        fprintf((FILE *)_Var16._M_head_impl,"\tprograms[%d] = programInit(%s, %s);\n",
                uVar30 & 0xffffffff,uVar17,
                shader.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::__cxx11::string::~string((string *)&shader);
        std::__cxx11::string::~string((string *)&shader_source);
      }
      fwrite("}\n\n",3,1,
             (FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                     super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                     super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      fwrite("static const GLuint draw_buffers[] = {GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1, GL_COLOR_ATTACHMENT2, GL_COLOR_ATTACHMENT3};\n\n"
             ,0x80,1,(FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                             super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                             super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      fwrite("static void videoPaint(float t) {\n",0x22,1,
             (FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                     super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                     super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      fwrite("\tint current_program;\n\tstatic unsigned int frame_seq = 0;\n\t++frame_seq;\n\tconst int ping = (int)(frame_seq&1), pong = (int)((frame_seq+1)&1);\n"
             ,0x8d,1,(FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                             super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                             super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      pCVar15 = (p->commands).
                super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pRVar32 = (Resources *)0x0;
      for (pCVar37 = (p->commands).
                     super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>.
                     _M_impl.super__Vector_impl_data._M_start; pCVar37 != pCVar15;
          pCVar37 = pCVar37 + 1) {
        switch(pCVar37->op) {
        case BindFramebuffer:
          lVar35 = (long)(pCVar37->bindFramebuffer).framebuffer.index;
          if (lVar35 == -1) {
            fwrite("\tglBindFramebuffer(GL_FRAMEBUFFER, 0);\n",0x27,1,
                   (FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                           super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                           super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
            uVar6 = local_1b8->width;
            uVar7 = local_1b8->height;
          }
          else {
            pFVar31 = (p->framebuffers).
                      super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_1b0 = pRVar32;
            fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                            super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                            super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                    "\tglBindFramebuffer(GL_FRAMEBUFFER, framebuffers[%d%s]);\n",lVar35,
                    *(undefined8 *)
                     (&DAT_001ea0f0 + (ulong)(pCVar37->bindFramebuffer).framebuffer.pingpong * 8));
            fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                            super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                            super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                    "\tglDrawBuffers(%d, draw_buffers);\n",
                    (ulong)(uint)pFVar31[lVar35].textures_count);
            iVar5 = pFVar31[lVar35].textures[0];
            pTVar33 = (p->textures).
                      super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            uVar6 = pTVar33[iVar5].w;
            uVar7 = pTVar33[iVar5].h;
            pRVar32 = local_1b0;
          }
          fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                          super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                  "\tglViewport(0, 0, %d, %d);\n",(ulong)uVar6,(ulong)uVar7);
          break;
        case UseProgram:
          pRVar32 = (Resources *)0x0;
          fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                          super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                  "\tcurrent_program = programs[%d];\n",
                  (ulong)(uint)(pCVar37->useProgram).program.index);
          fwrite("\tglUseProgram(current_program);\n",0x20,1,
                 (FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                         super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
          fwrite("\tglUniform1fv(glGetUniformLocation(current_program, \"u\"), AUTOMATION_SIZE, uniforms);\n"
                 ,0x56,1,(FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                                 super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                                 super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
          fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                          super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                  "\tglUniform2f(glGetUniformLocation(current_program, \"R\"), %d, %d);\n",
                  (ulong)(uint)local_1b8->width,(ulong)(uint)local_1b8->height);
          pcVar27 = "\tglUniform1f(glGetUniformLocation(current_program, \"t\"), t);\n";
          sStackY_260 = 0x3d;
          goto LAB_0010f1b2;
        case BindTexture:
          fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                          super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                  "\tglActiveTexture(GL_TEXTURE0 + %d);\n",(ulong)pRVar32 & 0xffffffff);
          fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                          super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                  "\tglBindTexture(GL_TEXTURE_2D, textures[%d%s]);\n",
                  (ulong)(uint)(pCVar37->bindTexture).texture.index,
                  *(undefined8 *)
                   (&DAT_001ea0f0 + (ulong)(pCVar37->bindTexture).texture.pingpong * 8));
          fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                          super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                  "\tglUniform1i(glGetUniformLocation(current_program, \"%s\"), %d);\n",
                  (pCVar37->bindTexture).name._M_dataplus._M_p,(ulong)pRVar32 & 0xffffffff);
          pRVar32 = (Resources *)(ulong)((int)pRVar32 + 1);
          break;
        case DrawFullscreen:
          pcVar27 = "\tglRects(-1,-1,1,1);\n";
          sStackY_260 = 0x15;
          goto LAB_0010f1b2;
        case Clear:
          fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                          super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                  "\tglClearColor(%f, %f, %f, %f);\n",SUB84((double)(pCVar37->clear).r,0),
                  (double)(pCVar37->clear).g,(double)(pCVar37->clear).b,(double)(pCVar37->clear).a);
          pcVar27 = "";
          if ((pCVar37->clear).depth != false) {
            pcVar27 = " | GL_DEPTH_BUFFER_BIT";
          }
          fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                          super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                  "\tglClear(GL_COLOR_BUFFER_BIT%s);\n",pcVar27);
          break;
        case Enable:
          FVar8 = (pCVar37->enable).flag;
          if (FVar8 == VertexProgramPointSize) {
            pcVar27 = "\tglEnable(GL_VERTEX_PROGRAM_POINT_SIZE);\n";
            sStackY_260 = 0x29;
          }
          else {
            if (FVar8 != DepthTest) break;
            pcVar27 = "\tglEnable(GL_DEPTH_TEST);\n";
            sStackY_260 = 0x1a;
          }
          goto LAB_0010f1b2;
        case Disable:
          FVar8 = (pCVar37->disable).flag;
          if (FVar8 == VertexProgramPointSize) {
            pcVar27 = "\tglDisable(GL_VERTEX_PROGRAM_POINT_SIZE);\n";
            sStackY_260 = 0x2a;
          }
          else {
            if (FVar8 != DepthTest) break;
            pcVar27 = "\tglDisable(GL_DEPTH_TEST);\n";
            sStackY_260 = 0x1b;
          }
LAB_0010f1b2:
          fwrite(pcVar27,sStackY_260,1,
                 (FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                         super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
          break;
        case DrawArrays:
          uVar30 = (ulong)(pCVar37->drawArrays).mode;
          if (uVar30 < 7) {
            puVar29 = &DAT_0019d714 + *(int *)(&DAT_0019d714 + uVar30 * 4);
          }
          else {
            puVar29 = (undefined *)0x0;
          }
          fprintf((FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                          super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                  "\tglDrawArrays(%s, %d, %d);\n",puVar29,(ulong)(uint)(pCVar37->drawArrays).start,
                  (ulong)(uint)(pCVar37->drawArrays).count);
        }
      }
      fwrite("}\n",2,1,
             (FILE *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                     super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                     super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      aAppDebugPrintf("Done exporting rendering pipeline to \'%s\'",__filename);
      *(bool *)((anon_union_32_1_53f96095_for_Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                 *)&local_1c8->super_path + 1) = true;
LAB_0010f312:
      IAutomation::ExportResult::~ExportResult(&automation_result);
    }
    Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected(&automation_export);
    __return_storage_ptr__ =
         (Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_1c8;
LAB_0010f334:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
    ::~_Rb_tree(&global_uniforms._M_t);
  }
  std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::~unique_ptr(&f);
  return (Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(pointer)__return_storage_ptr__;
}

Assistant:

Expected<void, std::string> exportC(Resources &res, const ExportSettings &settings, const renderdesc::Pipeline &p, const IAutomation &automation) {
	const char * const filename = settings.c_source.c_str();
	MSG("Exporting rendering pipeline to '%s'", filename);

	const auto f = std::unique_ptr<FILE, decltype(&fclose)>(fopen(filename, "w"), &fclose);
	if (!f)
		return Unexpected(format("Cannot open file '%s' for writing", filename));

	// Extract all uniforms from all shaders
	shader::UniformsMap global_uniforms;
	for (const auto &s: p.shader_filenames) {
		const auto shader = res.getShaderSource(s);
		if (!shader)
			return Unexpected(format("Cannot open shader '%s'", s.c_str()));

		// if (!shader->poll(1))
		// 	return Unexpected(format("Cannot read shader '%s'", s.c_str()));

		MSG("%s: uniforms: %d", s.c_str(), (int)shader->flatSource().uniforms().size());
		const auto result = shader::appendUniforms(global_uniforms, shader->flatSource().uniforms());
		if (!result)
			return Unexpected("Error merging uniforms from vertex: " + result.error());
	}

	// Export automation for all known uniforms
	auto automation_export = automation.writeExport("C", global_uniforms);
	if (!automation_export)
		return Unexpected(format("Error exporting automation data: %s", automation_export.error().c_str()));

	const IAutomation::ExportResult automation_result(std::move(automation_export.value()));

	// write shader sources given automation export
	for (const auto &s: p.shader_filenames) {
		const std::string vname = validateName(s);
		const auto shader = res.getShaderSource(s);

		auto shader_source = shaderPreprocessor(shader->flatSource(), automation_result);
		if (!shader_source)
			return Unexpected(format("Cannot preporcess shader '%s': %s", s.c_str(), shader_source.error().c_str()));

		if (auto result = writeShaderSource(f.get(), s, vname, shader_source.value(), settings)) {}
		else
			return Unexpected(format("Cannot write shader '%s': %s", vname.c_str(), result.error().c_str()));
	}

	// Write global data
	for (const auto &it: automation_result.sections) {
		if (it.type == Section::Type::Data) {
			fprintf(f.get(), "#pragma data_seg(\".%s\")\n", it.name.c_str());
			fprintf(f.get(), "%.*s\n", static_cast<int>(it.data.size()), it.data.data());
		}
	}

	if (!p.textures.empty())
		fprintf(f.get(), "static GLuint textures[%d];\n", (int)p.textures.size());

	if (!p.framebuffers.empty())
		fprintf(f.get(), "static GLuint framebuffers[%d];\n", (int)p.textures.size());

	fprintf(f.get(), "static GLuint programs[%d];\n", (int)p.programs.size());

	fprintf(f.get(), "\nstatic void videoInit() {\n");

	if (!p.textures.empty())
		fprintf(f.get(), "\tglGenTextures(%d, textures);\n", (int)p.textures.size());

	if (!p.framebuffers.empty())
		fprintf(f.get(), "\tglGenFramebuffers(%d, framebuffers);\n", (int)p.framebuffers.size());

	if (!p.textures.empty()) {
		for (size_t i = 0; i < p.textures.size(); ++i) {
			const renderdesc::Texture &t = p.textures[i];
			const char *comp = "", *type = "";

			switch (t.pixel_type) {
				case RGBA8:
					comp = "GL_RGBA";
					type = "GL_UNSIGNED_BYTE";
					break;
#ifndef ATTO_PLATFORM_RPI
				case RGBA16F:
					comp = "GL_RGBA16F";
					type = "GL_FLOAT";
					break;
				case RGBA32F:
					comp = "GL_RGBA32F";
					type = "GL_FLOAT";
					break;
#endif
			}

			fprintf(f.get(), "\ttextureInit(textures[%d], %d, %d, %s, %s);\n",
				(int)i, t.w, t.h, comp, type);
		}

		fprintf(f.get(), "\n");
	}

	if (!p.framebuffers.empty()) {
		for (size_t i = 0; i < p.framebuffers.size(); ++i) {
			const renderdesc::Framebuffer &fb = p.framebuffers[i];
			fprintf(f.get(), "\tglBindFramebuffer(GL_FRAMEBUFFER, framebuffers[%d]);\n", (int)i);
			for (int ti = 0; ti < fb.textures_count; ++ti) {
				fprintf(f.get(), "\tglFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + %d, "
					"GL_TEXTURE_2D, textures[%d], 0);\n", ti, fb.textures[ti]);
			}
		}

		fprintf(f.get(), "\n");
	}

	for (size_t i = 0; i < p.programs.size(); ++i) {
		fprintf(f.get(), "\tprograms[%d] = programInit(%s, %s);\n", (int)i,
			validateName(p.shader_filenames[p.programs[i].vertex]).c_str(),
			validateName(p.shader_filenames[p.programs[i].fragment]).c_str());
	}

	fprintf(f.get(), "}\n\n");

	// TODO actual count
	fprintf(f.get(), "static const GLuint draw_buffers[] = {GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1, GL_COLOR_ATTACHMENT2, GL_COLOR_ATTACHMENT3};\n\n");

	fprintf(f.get(), "static void videoPaint(float t) {\n");

	const char *pingpong[3] = {"", "+ping", "+pong"};
	fprintf(f.get(),
		"\tint current_program;\n"
		"\tstatic unsigned int frame_seq = 0;\n"
		"\t++frame_seq;\n"
		"\tconst int ping = (int)(frame_seq&1), pong = (int)((frame_seq+1)&1);\n");

	int first_texture_slot = 0;
	for (const auto &cmd: p.commands) {
		switch (cmd.op) {
			case renderdesc::Command::Op::BindFramebuffer:
				{
					const renderdesc::Command::BindFramebuffer &cmdfb = cmd.bindFramebuffer;
					if (cmdfb.framebuffer.index == -1) {
						fprintf(f.get(), "\tglBindFramebuffer(GL_FRAMEBUFFER, 0);\n");
						fprintf(f.get(), "\tglViewport(0, 0, %d, %d);\n", settings.width, settings.height);
					} else {
						const renderdesc::Framebuffer &fb = p.framebuffers[cmdfb.framebuffer.index];
						fprintf(f.get(), "\tglBindFramebuffer(GL_FRAMEBUFFER, framebuffers[%d%s]);\n",
							cmdfb.framebuffer.index, pingpong[cmdfb.framebuffer.pingpong]);
						fprintf(f.get(), "\tglDrawBuffers(%d, draw_buffers);\n", fb.textures_count);
						fprintf(f.get(), "\tglViewport(0, 0, %d, %d);\n",
							p.textures[fb.textures[0]].w,
							p.textures[fb.textures[0]].h);
					}
					break;
				}

			case renderdesc::Command::Op::UseProgram:
				{
					const renderdesc::Command::UseProgram &cmdp = cmd.useProgram;
					const int pi = cmdp.program.index;
					fprintf(f.get(), "\tcurrent_program = programs[%d];\n", pi);
					fprintf(f.get(), "\tglUseProgram(current_program);\n");
					fprintf(f.get(), "\tglUniform1fv(glGetUniformLocation(current_program, \"u\"), AUTOMATION_SIZE, uniforms);\n");
					fprintf(f.get(), "\tglUniform2f(glGetUniformLocation(current_program, \"R\"), %d, %d);\n", settings.width, settings.height);
					fprintf(f.get(), "\tglUniform1f(glGetUniformLocation(current_program, \"t\"), t);\n");

					// FIXME load automated uniforms

					first_texture_slot = 0;
					break;
				}

			case renderdesc::Command::Op::BindTexture:
				{
					const auto &cmdtex = cmd.bindTexture;
					const int slot = first_texture_slot++;
					fprintf(f.get(), "\tglActiveTexture(GL_TEXTURE0 + %d);\n", slot);
					fprintf(f.get(), "\tglBindTexture(GL_TEXTURE_2D, textures[%d%s]);\n", cmdtex.texture.index, pingpong[cmdtex.texture.pingpong]);
					fprintf(f.get(), "\tglUniform1i(glGetUniformLocation(current_program, \"%s\"), %d);\n", cmdtex.name.c_str(), slot);
					break;
				}

			case renderdesc::Command::Op::Clear:
				{
					const auto &cmdc = cmd.clear;
					fprintf(f.get(), "\tglClearColor(%f, %f, %f, %f);\n", cmdc.r, cmdc.g, cmdc.b, cmdc.a);
					fprintf(f.get(), "\tglClear(GL_COLOR_BUFFER_BIT%s);\n", cmdc.depth?" | GL_DEPTH_BUFFER_BIT":"");
					break;
				}

			case renderdesc::Command::Op::Enable:
				switch (cmd.enable.flag) {
					case renderdesc::Command::Flag::DepthTest:
						fprintf(f.get(), "\tglEnable(GL_DEPTH_TEST);\n");
						break;
#ifndef ATTO_PLATFORM_RPI
					case renderdesc::Command::Flag::VertexProgramPointSize:
						fprintf(f.get(), "\tglEnable(GL_VERTEX_PROGRAM_POINT_SIZE);\n");
						break;
#endif
				}
				break;
			case renderdesc::Command::Op::Disable:
				switch (cmd.disable.flag) {
					case renderdesc::Command::Flag::DepthTest:
						fprintf(f.get(), "\tglDisable(GL_DEPTH_TEST);\n");
						break;
#ifndef ATTO_PLATFORM_RPI
					case renderdesc::Command::Flag::VertexProgramPointSize:
						fprintf(f.get(), "\tglDisable(GL_VERTEX_PROGRAM_POINT_SIZE);\n");
						break;
#endif
				}
				break;
			case renderdesc::Command::Op::DrawArrays:
				{
					const char *mode = nullptr;
					switch (cmd.drawArrays.mode) {
						case renderdesc::Command::DrawArrays::Mode::Lines: mode = "GL_LINES"; break;
						case renderdesc::Command::DrawArrays::Mode::LineStrip: mode = "GL_LINE_STRIP"; break;
						case renderdesc::Command::DrawArrays::Mode::LineLoop: mode = "GL_LINE_LOOP"; break;
						case renderdesc::Command::DrawArrays::Mode::Points: mode = "GL_POINTS"; break;
						case renderdesc::Command::DrawArrays::Mode::Triangles: mode = "GL_TRIANGLES"; break;
						case renderdesc::Command::DrawArrays::Mode::TriangleStrip: mode = "GL_TRIANGLE_STRIP"; break;
						case renderdesc::Command::DrawArrays::Mode::TriangleFan: mode = "GL_TRIANGLE_FAN"; break;
					}
					fprintf(f.get(), "\tglDrawArrays(%s, %d, %d);\n", mode, cmd.drawArrays.start, cmd.drawArrays.count);
				}
				break;
			case renderdesc::Command::Op::DrawFullscreen:
				fprintf(f.get(), "\tglRects(-1,-1,1,1);\n");
				break;
		}
	}

	fprintf(f.get(), "}\n");
	MSG("Done exporting rendering pipeline to '%s'", filename);

	return Expected<void, std::string>();
}